

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

BOOL GetCPInfo(UINT CodePage,LPCPINFO lpCPInfo)

{
  BOOL BVar1;
  CP_MAPPING *pCVar2;
  uint local_24;
  BOOL bRet;
  CP_MAPPING *lpStruct;
  LPCPINFO lpCPInfo_local;
  UINT CodePage_local;
  
  local_24 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (CodePage != 0) {
    BVar1 = IsValidCodePage(CodePage);
    if (BVar1 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0x57);
      goto LAB_0014d6c4;
    }
  }
  if (lpCPInfo == (LPCPINFO)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(0x57);
  }
  else {
    pCVar2 = CODEPAGEGetData(CodePage);
    if (pCVar2 != (CP_MAPPING *)0x0) {
      lpCPInfo->MaxCharSize = pCVar2->nMaxByteSize;
      memcpy(lpCPInfo->LeadByte,pCVar2->LeadByte,0xc);
      memset(lpCPInfo->DefaultChar,0x3f,2);
    }
    local_24 = (uint)(pCVar2 != (CP_MAPPING *)0x0);
  }
LAB_0014d6c4:
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_24;
}

Assistant:

BOOL
PALAPI
GetCPInfo(
  IN UINT CodePage,
  OUT LPCPINFO lpCPInfo)
{
    const CP_MAPPING * lpStruct = NULL;
    BOOL bRet = FALSE;

    PERF_ENTRY(GetCPInfo);
    ENTRY("GetCPInfo(CodePage=%hu, lpCPInfo=%p)\n", CodePage, lpCPInfo);

    /*check if the input code page is valid*/
    if( CP_ACP != CodePage && !IsValidCodePage( CodePage ) )
    {
        /* error, invalid argument */
        ERROR("CodePage(%d) parameter is invalid\n",CodePage);
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    /*check if the lpCPInfo parameter is valid. */
    if( !lpCPInfo )
    {
        /* error, invalid argument */
        ERROR("lpCPInfo cannot be NULL\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    if ( NULL != ( lpStruct = CODEPAGEGetData( CodePage ) ) )
    {
        lpCPInfo->MaxCharSize = lpStruct->nMaxByteSize;;
        memcpy( lpCPInfo->LeadByte, lpStruct->LeadByte , MAX_LEADBYTES );

        /* Don't need to be set, according to the spec. */
        memset( lpCPInfo->DefaultChar, '?', MAX_DEFAULTCHAR );

        bRet = TRUE;
    }

done:
    LOGEXIT("GetCPInfo returns BOOL %d \n",bRet);
    PERF_EXIT(GetCPInfo);
    return bRet;
}